

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O3

int sptk::snack::dp_f0(float *fdata,int buff_size,int sdstep,double freq,F0_params *par,
                      float **f0p_pt,float **vuvp_pt,float **rms_speech_pt,float **acpkp_pt,
                      int *vecsize,int last_time,Buffer *buffer)

{
  short sVar1;
  frame_rec *pfVar2;
  int *piVar3;
  float *pfVar4;
  F0_params *par_00;
  ulong uVar5;
  double dVar6;
  Stat *pSVar7;
  Buffer *pBVar8;
  Frame *pFVar9;
  Frame *pFVar10;
  float *pfVar11;
  int iVar12;
  int size;
  Dprec *pDVar13;
  frame_rec *pfVar14;
  float *pfVar15;
  int iVar16;
  long lVar17;
  short sVar18;
  size_t size_00;
  Buffer *pdata;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  float *pfVar22;
  short *psVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  double extraout_XMM0_Qa;
  float fVar32;
  Stat *local_108;
  uint local_fc;
  int local_f0;
  int ncand;
  float maxval;
  float *local_b8;
  ulong local_b0;
  snack *local_a8;
  float *local_a0;
  double local_98;
  int samsds;
  int maxloc;
  float engref;
  ulong local_80;
  Stat *local_78;
  Buffer *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float *local_50;
  float **local_48;
  float **local_40;
  F0_params *local_38;
  
  uVar5 = 0;
  if (buffer->pad <= buff_size) {
    uVar5 = ((long)buff_size - (long)buffer->pad) / (long)buffer->step;
  }
  local_48 = f0p_pt;
  local_40 = vuvp_pt;
  if (debug_level != 0) {
    fprintf(_stderr,"******* Computing %d dp frames ******** from %d points\n",uVar5 & 0xffffffff,
            buff_size);
  }
  iVar21 = (int)(freq / 2000.0);
  local_fc = buffer->step;
  iVar16 = (int)uVar5;
  local_70 = (Buffer *)fdata;
  local_38 = par;
  if (1 < iVar21) {
    samsds = (int)(local_fc * (iVar16 + -1) + buffer->ncomp) / iVar21;
    if (samsds < 1) {
      return 1;
    }
    local_70 = (Buffer *)
               downsample(fdata,buff_size,sdstep,freq,&samsds,iVar21,buffer->first_time,last_time,
                          &buffer->ncoeff,&buffer->ncoefft,buffer->b,&buffer->foutput,&buffer->co,
                          &buffer->mem,buffer->state,&buffer->fsize);
    if (local_70 == (Buffer *)0x0) {
      dp_f0();
      return 1;
    }
    local_fc = buffer->step;
  }
  local_108 = buffer->stat;
  pfVar11 = buffer->mem;
  iVar12 = (int)(freq * 0.02);
  size = (int)(freq * 0.03);
  local_a8 = (snack *)CONCAT44(local_a8._4_4_,buffer->first_time);
  dVar31 = freq;
  if (((buffer->first_time == 0) && (iVar16 <= buffer->nframes_old)) && (local_108 != (Stat *)0x0))
  {
    uVar19 = buffer->memsize;
  }
  else {
    if (local_108 != (Stat *)0x0) {
      ckfree(local_108->stat);
      ckfree(local_108->rms);
      ckfree(local_108->rms_ratio);
      ckfree(local_108);
    }
    if (pfVar11 != (float *)0x0) {
      ckfree(pfVar11);
    }
    local_108 = (Stat *)ckalloc(0x18);
    size_00 = (long)iVar16 << 2;
    pfVar11 = (float *)ckalloc(size_00);
    local_108->stat = pfVar11;
    pfVar11 = (float *)ckalloc(size_00);
    local_108->rms = pfVar11;
    pfVar11 = (float *)ckalloc(size_00);
    local_108->rms_ratio = pfVar11;
    uVar19 = size + iVar12;
    pfVar11 = (float *)ckalloc((long)(int)uVar19 * 4);
    if (0 < (int)uVar19) {
      memset(pfVar11,0,(ulong)(uVar19 - 1) * 4 + 4);
    }
    buffer->nframes_old = iVar16;
    buffer->memsize = uVar19;
    buffer->stat = local_108;
    buffer->mem = pfVar11;
  }
  uVar25 = (ulong)uVar19;
  if (iVar16 != 0) {
    dVar30 = freq / 1000.0 + 2.0;
    local_f0 = (int)dVar30;
    if (100 < local_f0) {
      fprintf(_stderr,"Optimim order (%d) exceeds that allowable (%d); reduce Fs\n",local_f0,100);
      local_f0 = 100;
      dVar30 = extraout_XMM0_Qa;
    }
    local_58 = (ulong)(uint)((int)uVar19 / 2);
    pBVar8 = (Buffer *)fdata;
    uVar20 = local_58;
    if (0 < (int)uVar19) {
      do {
        dVar30 = (double)(ulong)(uint)*(float *)&pBVar8->headF;
        pfVar11[uVar20] = *(float *)&pBVar8->headF;
        uVar20 = uVar20 + 1;
        pBVar8 = (Buffer *)((long)&pBVar8->headF + 4);
      } while (uVar20 < uVar25);
    }
    local_68 = uVar5 & 0xffffffff;
    local_b8 = pfVar11;
    local_80 = uVar25;
    if (0 < iVar16) {
      lVar17 = (long)((iVar12 - size) / 2);
      pBVar8 = (Buffer *)((long)&((Buffer *)fdata)->headF + lVar17 * 4);
      pfVar15 = (float *)((long)&((Buffer *)fdata)->headF + (long)buff_size * 4);
      pdata = (Buffer *)((long)pBVar8 + (long)iVar12 * -4);
      local_78 = (Stat *)&local_108->rms_ratio;
      local_50 = pfVar11 + lVar17 + (int)uVar19 / 2;
      uVar5 = (ulong)(int)local_fc;
      local_60 = (ulong)(uVar19 - local_fc);
      local_98 = (double)(ulong)local_fc;
      local_a0 = pfVar11 + (int)(uVar19 - local_fc);
      lVar26 = (long)&((Buffer *)fdata)->headF + (long)size * 4 + lVar17 * 4;
      lVar17 = uVar5 * 4;
      uVar25 = 0;
      local_b0 = uVar5;
      do {
        pfVar11 = (float *)((long)&pBVar8->headF + (long)size * 4);
        fVar28 = SUB84(dVar30,0);
        fVar29 = SUB84(dVar31,0);
        iVar12 = (int)buffer;
        pSVar7 = local_108;
        if (((pdata < fdata) || (pBVar8 < fdata)) || (pfVar15 < pfVar11)) {
          if ((int)local_a8 != 0) {
            if (((pdata < fdata) && (fdata <= pBVar8)) && (pfVar11 <= pfVar15)) {
              fVar28 = get_similarity(local_f0,size,(float *)0x0,(float *)pBVar8,
                                      local_108->rms + uVar25,local_78->stat + uVar25,fVar28,fVar29,
                                      1,iVar12,(Buffer *)fdata);
              dVar30 = (double)(ulong)(uint)fVar28;
            }
            else {
              local_108->rms[uVar25] = 0.0;
              local_108->stat[uVar25] = 0.002;
              dVar30 = 5.26354424712089e-315;
              pSVar7 = local_78;
            }
            goto LAB_001192b8;
          }
          if ((pdata < fdata) && (pfVar11 <= pfVar15)) {
            fVar28 = get_similarity(local_f0,size,local_b8,local_50,local_108->rms + uVar25,
                                    local_108->rms_ratio + uVar25,fVar28,fVar29,0,iVar12,
                                    (Buffer *)fdata);
            dVar30 = (double)(ulong)(uint)fVar28;
            local_108->stat[uVar25] = fVar28;
            uVar5 = local_b0;
            if ((Buffer *)((long)&pdata->headF + local_b0 * 4) < fdata) {
              pfVar11 = local_b8;
              uVar20 = local_60;
              if (0 < (int)local_60) {
                do {
                  dVar30 = (double)(ulong)(uint)pfVar11[local_b0];
                  *pfVar11 = pfVar11[local_b0];
                  pfVar11 = pfVar11 + 1;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
              if (0 < (int)local_fc) {
                dVar6 = 0.0;
                do {
                  fVar28 = *(float *)(lVar26 + (long)dVar6 * 4);
                  dVar30 = (double)(ulong)(uint)fVar28;
                  local_a0[(long)dVar6] = fVar28;
                  dVar6 = (double)((long)dVar6 + 1);
                } while (local_98 != dVar6);
              }
            }
          }
        }
        else {
          fVar28 = get_similarity(local_f0,size,(float *)pdata,(float *)pBVar8,
                                  local_108->rms + uVar25,local_108->rms_ratio + uVar25,fVar28,
                                  fVar29,0,iVar12,(Buffer *)fdata);
          dVar30 = (double)(ulong)(uint)fVar28;
          uVar5 = local_b0;
LAB_001192b8:
          pSVar7->stat[uVar25] = SUB84(dVar30,0);
        }
        uVar25 = uVar25 + 1;
        pdata = (Buffer *)((long)&pdata->headF + uVar5 * 4);
        pBVar8 = (Buffer *)((long)&pBVar8->headF + uVar5 * 4);
        lVar26 = lVar26 + lVar17;
      } while (uVar25 != local_68);
    }
    if ((1 < (int)local_80) &&
       (fdata <= (Buffer *)((long)fdata + (long)(int)(local_fc * iVar16) * 4 + -4))) {
      pBVar8 = (Buffer *)((long)fdata + (long)(int)(local_fc * iVar16) * 4 + -8);
      uVar5 = local_58;
      do {
        local_b8[uVar5 - 1] = *(float *)((long)&pBVar8->headF + 4);
        if (uVar5 < 2) break;
        uVar5 = uVar5 - 1;
        bVar27 = fdata <= pBVar8;
        pBVar8 = (Buffer *)&pBVar8[-1].dbsize;
      } while (bVar27);
    }
    if (local_108 == (Stat *)0x0) {
      dp_f0();
      return 1;
    }
    pfVar11 = local_108->stat;
    pfVar15 = local_108->rms_ratio;
    if ((iVar16 < 1) || (buffer->first_time != 0)) {
      if (iVar16 < 1) goto LAB_00119810;
    }
    else {
      buffer->headF = buffer->headF->next;
    }
    local_a8 = (snack *)&buffer->size_cir_buffer;
    local_b0 = (ulong)(iVar16 - 1);
    uVar5 = 0;
    do {
      par_00 = local_38;
      pfVar14 = buffer->headF;
      if (pfVar14 == buffer->tailF->prev) {
        if (5 < buffer->cir_buff_growth_count) {
          fprintf(_stderr,
                  "too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n"
                 );
          return 1;
        }
        if (debug_level != 0) {
          dp_f0(local_a8);
        }
        pFVar9 = alloc_frame(buffer->nlags,par_00->n_cands);
        pfVar14 = buffer->headF;
        pfVar14->next = pFVar9;
        pFVar9->prev = pfVar14;
        if (1 < buffer->size_cir_buffer) {
          iVar12 = 1;
          pFVar10 = pFVar9;
          do {
            pFVar9 = alloc_frame(buffer->nlags,par_00->n_cands);
            pFVar10->next = pFVar9;
            pFVar9->prev = pFVar10;
            iVar12 = iVar12 + 1;
            pFVar10 = pFVar9;
          } while (iVar12 < buffer->size_cir_buffer);
          pfVar14 = buffer->headF;
        }
        pfVar2 = buffer->tailF;
        pFVar9->next = pfVar2;
        pfVar2->prev = pFVar9;
        buffer->cir_buff_growth_count = buffer->cir_buff_growth_count + 1;
      }
      pfVar14->rms = local_108->rms[uVar5];
      get_fast_cands(fdata,(float *)local_70,(int)uVar5,buffer->step,buffer->size,iVar21,
                     buffer->start,buffer->nlags,&engref,&maxloc,&maxval,pfVar14->cp,buffer->peaks,
                     buffer->locs,&ncand,par_00,&buffer->dbsize,&buffer->dbdata);
      pFVar9 = buffer->headF;
      piVar3 = buffer->locs;
      pDVar13 = pFVar9->dp;
      psVar23 = pDVar13->locs;
      pfVar22 = pDVar13->pvals;
      pfVar4 = buffer->peaks;
      if ((ulong)(uint)ncand != 0) {
        lVar26 = 0;
        lVar24 = 0;
        lVar17 = 0;
        do {
          pfVar22[lVar17] = pfVar4[lVar17];
          psVar23[lVar17] = (short)piVar3[lVar17];
          lVar17 = lVar17 + 1;
          lVar24 = lVar24 + -2;
          lVar26 = lVar26 + -4;
        } while (ncand != (int)lVar17);
        psVar23 = (short *)((long)psVar23 - lVar24);
        pfVar22 = (float *)((long)pfVar22 - lVar26);
      }
      *psVar23 = -1;
      *pfVar22 = maxval;
      pfVar22 = pDVar13->mpvals;
      pfVar22[ncand] = maxval + buffer->vbias;
      if (0 < ncand) {
        uVar25 = 0;
        do {
          pfVar22[uVar25] = 1.0 - (1.0 - (float)piVar3[uVar25] * buffer->lagwt) * pfVar4[uVar25];
          uVar25 = uVar25 + 1;
        } while ((uint)ncand != uVar25);
      }
      uVar19 = ncand + 1;
      pDVar13->ncands = (short)uVar19;
      bVar27 = -1 < ncand;
      ncand = uVar19;
      if (bVar27) {
        sVar1 = pFVar9->prev->dp->ncands;
        local_a0 = (float *)(ulong)uVar19;
        pfVar22 = (float *)0x0;
        do {
          sVar18 = pFVar9->dp->locs[(long)pfVar22];
          if (sVar18 < 1) {
            if (sVar1 < 1) goto LAB_00119739;
            pDVar13 = pFVar9->prev->dp;
            uVar20 = 0;
            uVar25 = 0;
            fVar28 = 3.4028235e+38;
            do {
              if (pDVar13->locs[uVar20] < 1) {
                fVar29 = 0.0;
              }
              else {
                fVar29 = buffer->tfact_a * pfVar15[uVar5] +
                         buffer->tfact_s * pfVar11[uVar5] + buffer->tcost;
              }
              fVar29 = fVar29 + pDVar13->dpvals[uVar20];
              if (fVar29 < fVar28) {
                uVar25 = uVar20 & 0xffffffff;
              }
              sVar18 = (short)uVar25;
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              fVar28 = fVar29;
              uVar20 = uVar20 + 1;
            } while ((uint)(int)sVar1 != uVar20);
          }
          else if (sVar1 < 1) {
LAB_00119739:
            sVar18 = 0;
            fVar28 = 3.4028235e+38;
          }
          else {
            local_98 = (double)(int)sVar18;
            pDVar13 = pFVar9->prev->dp;
            uVar20 = 0;
            uVar25 = 0;
            fVar28 = 3.4028235e+38;
            do {
              if (pDVar13->locs[uVar20] < 1) {
                fVar29 = buffer->tfact_a / pfVar15[uVar5] +
                         buffer->tfact_s * pfVar11[uVar5] + buffer->tcost;
              }
              else {
                dVar31 = log(local_98 / (double)(int)pDVar13->locs[uVar20]);
                fVar29 = (float)dVar31;
                fVar32 = ABS(buffer->ln2 + fVar29) + buffer->fdouble;
                if (ABS(fVar29) <= fVar32) {
                  fVar32 = ABS(fVar29);
                }
                fVar29 = ABS(fVar29 - buffer->ln2) + buffer->fdouble;
                if (fVar32 <= fVar29) {
                  fVar29 = fVar32;
                }
                fVar29 = fVar29 * buffer->freqwt;
                pFVar9 = buffer->headF;
                pDVar13 = pFVar9->prev->dp;
              }
              fVar29 = fVar29 + pDVar13->dpvals[uVar20];
              if (fVar29 < fVar28) {
                uVar25 = uVar20 & 0xffffffff;
              }
              sVar18 = (short)uVar25;
              if (fVar28 <= fVar29) {
                fVar29 = fVar28;
              }
              fVar28 = fVar29;
              uVar20 = uVar20 + 1;
            } while ((uint)(int)sVar1 != uVar20);
          }
          if ((uVar5 == 0) && (buffer->first_time != 0)) {
            pDVar13 = pFVar9->dp;
            pDVar13->dpvals[(long)pfVar22] = pDVar13->mpvals[(long)pfVar22];
            sVar18 = 0;
          }
          else {
            pDVar13 = pFVar9->dp;
            pDVar13->dpvals[(long)pfVar22] = fVar28 + pDVar13->mpvals[(long)pfVar22];
          }
          pDVar13->prept[(long)pfVar22] = sVar18;
          pfVar22 = (float *)((long)pfVar22 + 1);
        } while (pfVar22 != local_a0);
      }
      if (uVar5 < local_b0) {
        buffer->headF = pFVar9->next;
      }
      if (1 < debug_level) {
        fprintf(_stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",(double)engref,(double)maxval,
                uVar5 & 0xffffffff,(ulong)(uint)maxloc);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_68);
  }
LAB_00119810:
  *vecsize = 0;
  iVar16 = iVar16 + buffer->num_active_frames;
  buffer->num_active_frames = iVar16;
  if ((last_time != 0) || (buffer->size_frame_hist <= iVar16)) {
    if (debug_level != 0) {
      fprintf(_stderr,"available frames for backtracking: %d\n");
    }
    pFVar9 = buffer->headF;
    pDVar13 = pFVar9->dp;
    sVar1 = pDVar13->ncands;
    uVar19 = (uint)sVar1;
    if (sVar1 < 1) {
      uVar5 = 0;
    }
    else {
      psVar23 = pDVar13->prept;
      pfVar11 = pDVar13->dpvals;
      piVar3 = buffer->pcands;
      uVar25 = 0;
      fVar28 = 3.4028235e+38;
      uVar5 = 0;
      do {
        if (pfVar11[uVar25] < fVar28) {
          uVar5 = uVar25 & 0xffffffff;
          fVar28 = pfVar11[uVar25];
        }
        piVar3[uVar25] = (int)psVar23[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar19 != uVar25);
    }
    if (last_time == 0) {
      uVar25 = 0;
      pfVar14 = pFVar9;
      do {
        uVar25 = (ulong)((int)uVar25 + 1);
        pfVar14 = pfVar14->prev;
        if (sVar1 < 2) {
LAB_00119935:
          buffer->cmpthF = pfVar14;
          uVar5 = (ulong)(uint)*buffer->pcands;
          if (debug_level != 0) {
            fprintf(_stderr,"paths went back %d frames before converging\n",uVar25);
            pfVar14 = buffer->cmpthF;
          }
          goto LAB_00119950;
        }
        bVar27 = true;
        uVar20 = 1;
        do {
          if (*buffer->pcands != buffer->pcands[uVar20]) {
            bVar27 = false;
          }
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
        if (bVar27) goto LAB_00119935;
        if (0 < sVar1) {
          psVar23 = pfVar14->dp->prept;
          piVar3 = buffer->pcands;
          uVar20 = 0;
          do {
            piVar3[uVar20] = (int)psVar23[piVar3[uVar20]];
            uVar20 = uVar20 + 1;
          } while (uVar19 != uVar20);
        }
      } while (pfVar14 != buffer->tailF);
      if (buffer->num_active_frames < buffer->size_frame_out) {
        buffer->cmpthF = (Frame *)0x0;
        goto LAB_00119ba8;
      }
    }
    buffer->cmpthF = pFVar9;
    pfVar14 = pFVar9;
LAB_00119950:
    if (pfVar14 == buffer->tailF->prev) {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      do {
        if (uVar25 == (uint)buffer->output_buf_size) {
          iVar16 = buffer->output_buf_size * 2;
          buffer->output_buf_size = iVar16;
          if (debug_level != 0) {
            fprintf(_stderr,"reallocating space for output frames: %d\n");
            iVar16 = buffer->output_buf_size;
          }
          pfVar11 = (float *)ckrealloc(buffer->rms_speech,(long)iVar16 << 2);
          buffer->rms_speech = pfVar11;
          pfVar11 = (float *)ckrealloc(buffer->f0p,(long)buffer->output_buf_size << 2);
          buffer->f0p = pfVar11;
          pfVar11 = (float *)ckrealloc(buffer->vuvp,(long)buffer->output_buf_size << 2);
          buffer->vuvp = pfVar11;
          pfVar11 = (float *)ckrealloc(buffer->acpkp,(long)buffer->output_buf_size << 2);
          buffer->acpkp = pfVar11;
        }
        else {
          pfVar11 = buffer->acpkp;
        }
        buffer->rms_speech[uVar25] = pfVar14->rms;
        pDVar13 = pfVar14->dp;
        iVar21 = (int)uVar5;
        pfVar11[uVar25] = pDVar13->pvals[iVar21];
        sVar1 = pDVar13->locs[iVar21];
        iVar16 = (int)sVar1;
        pfVar11 = buffer->vuvp;
        pfVar11[uVar25] = 1.0;
        uVar5 = (ulong)(uint)(int)pDVar13->prept[iVar21];
        if (sVar1 < 1) {
          pfVar15 = buffer->f0p;
          pfVar15[uVar25] = 0.0;
          pfVar11[uVar25] = 0.0;
        }
        else {
          fVar28 = (float)iVar16;
          iVar21 = iVar16 - buffer->start;
          if ((iVar21 != 0 && buffer->start <= iVar16) && (iVar16 < buffer->stop)) {
            pfVar15 = pfVar14->cp->correl;
            fVar29 = pfVar15[iVar21];
            fVar32 = (pfVar15[(long)iVar21 + 1] + pfVar15[(long)iVar21 + -1]) - (fVar29 + fVar29);
            fVar32 = fVar32 + fVar32;
            if (1e-06 < ABS(fVar32)) {
              fVar28 = fVar28 + (2.0 - (fVar29 * -8.0 +
                                       pfVar15[(long)iVar21 + 1] * 5.0 +
                                       pfVar15[(long)iVar21 + -1] * 3.0) / fVar32);
            }
          }
          pfVar15 = buffer->f0p;
          pfVar15[uVar25] = (float)(freq / (double)fVar28);
        }
        pfVar14 = pfVar14->prev;
        if (1 < debug_level) {
          fprintf(_stderr," i:%4d%8.1f%8.1f\n",(double)pfVar15[uVar25],(double)pfVar11[uVar25],
                  uVar25 & 0xffffffff);
        }
        uVar25 = uVar25 + 1;
      } while (pfVar14 != buffer->tailF->prev);
    }
    *vecsize = (int)uVar25;
    buffer->tailF = buffer->cmpthF->next;
    buffer->num_active_frames = buffer->num_active_frames - (int)uVar25;
  }
LAB_00119ba8:
  if (debug_level != 0) {
    dp_f0((snack *)vecsize);
  }
  *local_48 = buffer->f0p;
  *local_40 = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  if (buffer->first_time != 0) {
    buffer->first_time = 0;
  }
  return 0;
}

Assistant:

dp_f0(float *fdata, int buff_size, int sdstep, double freq, F0_params *par,
      float **f0p_pt, float **vuvp_pt, float **rms_speech_pt, float **acpkp_pt,
      int *vecsize, int last_time, Buffer *buffer)
{
  float  maxval, engref, *sta, *rms_ratio, *dsdata;
  float  *downsample(float *input, int samsin, int state_idx, double freq,
                     int *samsout, int decimate, int first_time, int last_time,
                     int *ncoeff, int *ncoefft, float *b, float **foutput,
                     float **co, float **mem, float *state, int *fsize);
  register float ttemp, ftemp, ft1, ferr, err, errmin;
  register int  i, j, k, loc1, loc2;
  int   nframes, maxloc, ncand, ncandp, minloc,
        decimate, samsds;

  Stat *stat = NULL;

  nframes = get_Nframes((long) buff_size, buffer->pad, buffer->step); /* # of whole frames */

  if(debug_level)
    Fprintf(stderr,
	    "******* Computing %d dp frames ******** from %d points\n", nframes, buff_size);

  /* Now downsample the signal for coarse peak estimates. */

  decimate = (int)(freq/2000.0);    /* downsample to about 2kHz */
  if (decimate <= 1)
    dsdata = fdata;
  else {
    samsds = ((nframes-1) * buffer->step + buffer->ncomp) / decimate;
    if (samsds < 1)
      return 1;                     /* skip final frame if it is too small */
    dsdata = downsample(fdata, buff_size, sdstep, freq, &samsds, decimate, 
			buffer->first_time, last_time, &buffer->ncoeff,
                        &buffer->ncoefft, buffer->b, &buffer->foutput,
                        &buffer->co, &buffer->mem, buffer->state, &buffer->fsize);
    if (!dsdata) {
      Fprintf(stderr, "can't get downsampled data.\n");
      return 1;
    }
  }

  /* Get a function of the "stationarity" of the speech signal. */

  stat = get_stationarity(fdata, freq, buff_size, nframes, buffer->step, buffer->first_time,
                          buffer);
  if (!stat) { 
    Fprintf(stderr, "can't get stationarity\n");
    return(1);
  }
  sta = stat->stat;
  rms_ratio = stat->rms_ratio;

  /***********************************************************************/
  /* MAIN FUNDAMENTAL FREQUENCY ESTIMATION LOOP */
  /***********************************************************************/
  if(!buffer->first_time && nframes > 0) buffer->headF = buffer->headF->next;

  for(i = 0; i < nframes; i++) {
 
    /* NOTE: This buffer growth provision is probably not necessary.
       It was put in (with errors) by Derek Lin and apparently never
       tested.  My tests and analysis suggest it is completely
       superfluous. DT 9/5/96 */
    /* Dynamically allocating more space for the circular buffer */
    if(buffer->headF == buffer->tailF->prev){
      Frame *frm;

      if(buffer->cir_buff_growth_count > 5){
	Fprintf(stderr,
		"too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n",buffer->cir_buff_growth_count);
	return(1);
      }
      if(debug_level) 
	Fprintf(stderr, "allocating %d more frames for DP circ. buffer.\n", buffer->size_cir_buffer);
      frm = alloc_frame(buffer->nlags, par->n_cands);
      buffer->headF->next = frm;
      frm->prev = buffer->headF;
      for(k=1; k<buffer->size_cir_buffer; k++){
	frm->next = alloc_frame(buffer->nlags, par->n_cands);
	frm->next->prev = frm;
	frm = frm->next;
      }
      frm->next = buffer->tailF;
      buffer->tailF->prev = frm;
      buffer->cir_buff_growth_count++;
    }

    buffer->headF->rms = stat->rms[i];
    get_fast_cands(fdata, dsdata, i, buffer->step, buffer->size, decimate, buffer->start,
		   buffer->nlags, &engref, &maxloc,
		   &maxval, buffer->headF->cp, buffer->peaks, buffer->locs, &ncand, par,
		   &buffer->dbsize, &buffer->dbdata);
    
    /*    Move the peak value and location arrays into the dp structure */
    {
      register float *ftp1, *ftp2;
      register short *sp1;
      register int *sp2;
      
      for(ftp1 = buffer->headF->dp->pvals, ftp2 = buffer->peaks,
	  sp1 = buffer->headF->dp->locs, sp2 = buffer->locs, j=ncand; j--; ) {
	*ftp1++ = *ftp2++;
	*sp1++ = *sp2++;
      }
      *sp1 = -1;		/* distinguish the UNVOICED candidate */
      *ftp1 = maxval;
      buffer->headF->dp->mpvals[ncand] = buffer->vbias+maxval; /* (high cost if cor. is high)*/
    }

    /* Apply a lag-dependent weight to the peaks to encourage the selection
       of the first major peak.  Translate the modified peak values into
       costs (high peak ==> low cost). */
    for(j=0; j < ncand; j++){
      ftemp = 1.0f - ((float)buffer->locs[j] * buffer->lagwt);
      buffer->headF->dp->mpvals[j] = 1.0f - (buffer->peaks[j] * ftemp);
    }
    ncand++;			/* include the unvoiced candidate */
    buffer->headF->dp->ncands = ncand;

    /*********************************************************************/
    /*    COMPUTE THE DISTANCE MEASURES AND ACCUMULATE THE COSTS.       */
    /*********************************************************************/

    ncandp = buffer->headF->prev->dp->ncands;
    for(k=0; k<ncand; k++){	/* for each of the current candidates... */
      minloc = 0;
      errmin = FLT_MAX;
      if((loc2 = buffer->headF->dp->locs[k]) > 0) { /* current cand. is voiced */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  /*    Get cost due to inter-frame period change. */
	  loc1 = buffer->headF->prev->dp->locs[j];
	  if (loc1 > 0) { /* prev. was voiced */
	    ftemp = (float) log(((double) loc2) / loc1);
	    ttemp = (float) fabs(ftemp);
	    ft1 = (float) (buffer->fdouble + fabs(ftemp + buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ft1 = (float) (buffer->fdouble + fabs(ftemp - buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ferr = ttemp * buffer->freqwt;
	  } else {		/* prev. was unvoiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a / rms_ratio[i]);
	  }
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      } else {			/* this is the unvoiced candidate */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  
	  /*    Get voicing transition cost. */
	  if (buffer->headF->prev->dp->locs[j] > 0) { /* previous was voiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a * rms_ratio[i]);
	  }
	  else
	    ferr = 0.0;
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      }
      /* Now have found the best path from this cand. to prev. frame */
      if (buffer->first_time && i==0) {		/* this is the first frame */
	buffer->headF->dp->dpvals[k] = buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = 0;
      } else {
	buffer->headF->dp->dpvals[k] = errmin + buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = minloc;
      }
    } /*    END OF THIS DP FRAME */

    if (i < nframes - 1)
      buffer->headF = buffer->headF->next;
    
    if (debug_level >= 2) {
      Fprintf(stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",
	      i,engref,maxval,maxloc);
    }
    
  } /* end for (i ...) */

  /***************************************************************/
  /* DONE WITH FILLING DP STRUCTURES FOR THE SET OF SAMPLED DATA */
  /*    NOW FIND A CONVERGED DP PATH                             */
  /***************************************************************/

  *vecsize = 0;			/* # of output frames returned */

  buffer->num_active_frames += nframes;

  if( buffer->num_active_frames >= buffer->size_frame_hist  || last_time ){
    Frame *frm;
    int  num_paths, best_cand, frmcnt, checkpath_done = 1;
    float patherrmin;
      
    if(debug_level)
      Fprintf(stderr, "available frames for backtracking: %d\n",
buffer->num_active_frames);
      
    patherrmin = FLT_MAX;
    best_cand = 0;
    num_paths = buffer->headF->dp->ncands;

    /* Get the best candidate for the final frame and initialize the
       paths' backpointers. */
    frm = buffer->headF;
    for(k=0; k < num_paths; k++) {
      if (patherrmin > buffer->headF->dp->dpvals[k]){
	patherrmin = buffer->headF->dp->dpvals[k];
	best_cand = k;	/* index indicating the best candidate at a path */
      }
      buffer->pcands[k] = frm->dp->prept[k];
    }

    if(last_time){     /* Input data was exhausted. force final outputs. */
      buffer->cmpthF = buffer->headF;		/* Use the current frame as starting point. */
    } else {
      /* Starting from the most recent frame, trace back each candidate's
	 best path until reaching a common candidate at some past frame. */
      frmcnt = 0;
      while (1) {
	frm = frm->prev;
	frmcnt++;
	checkpath_done = 1;
	for(k=1; k < num_paths; k++){ /* Check for convergence. */
	  if(buffer->pcands[0] != buffer->pcands[k])
	    checkpath_done = 0;
	}
	if( ! checkpath_done) { /* Prepare for checking at prev. frame. */
	  for(k=0; k < num_paths; k++){
	    buffer->pcands[k] = frm->dp->prept[buffer->pcands[k]];
	  }
	} else {	/* All paths have converged. */
	  buffer->cmpthF = frm;
	  best_cand = buffer->pcands[0];
	  if(debug_level)
	    Fprintf(stderr,
		    "paths went back %d frames before converging\n",frmcnt);
	  break;
	}
	if(frm == buffer->tailF){	/* Used all available data? */
	  if( buffer->num_active_frames < buffer->size_frame_out) { /* Delay some more? */
	    checkpath_done = 0; /* Yes, don't backtrack at this time. */
	    buffer->cmpthF = NULL;
	  } else {		/* No more delay! Force best-guess output. */
	    checkpath_done = 1;
	    buffer->cmpthF = buffer->headF;
	    /*	    Fprintf(stderr,
		    "WARNING: no converging path found after going back %d frames, will use the lowest cost path\n",num_active_frames);*/
	  }
	  break;
	} /* end if (frm ...) */
      }	/* end while (1) */
    } /* end if (last_time) ... else */

    /*************************************************************/
    /* BACKTRACKING FROM cmpthF (best_cand) ALL THE WAY TO tailF    */
    /*************************************************************/
    i = 0;
    frm = buffer->cmpthF;	/* Start where convergence was found (or faked). */
    while( frm != buffer->tailF->prev && checkpath_done){
      if( i == buffer->output_buf_size ){ /* Need more room for outputs? */
	buffer->output_buf_size *= 2;
	if(debug_level)
	  Fprintf(stderr,
		  "reallocating space for output frames: %d\n",
		  buffer->output_buf_size);
	buffer->rms_speech = (float *) ckrealloc((void *) buffer->rms_speech,
				       sizeof(float) * buffer->output_buf_size);
	/*	spsassert(rms_speech, "rms_speech realloc failed in dp_f0()");*/
	buffer->f0p = (float *) ckrealloc((void *) buffer->f0p,
				sizeof(float) * buffer->output_buf_size);
	/*	spsassert(f0p, "f0p realloc failed in dp_f0()");*/
	buffer->vuvp = (float *) ckrealloc((void *) buffer->vuvp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(vuvp, "vuvp realloc failed in dp_f0()");*/
	buffer->acpkp = (float *) ckrealloc((void *) buffer->acpkp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(acpkp, "acpkp realloc failed in dp_f0()");*/
      }
      buffer->rms_speech[i] = frm->rms;
      buffer->acpkp[i] =  frm->dp->pvals[best_cand];
      loc1 = frm->dp->locs[best_cand];
      buffer->vuvp[i] = 1.0;
      best_cand = frm->dp->prept[best_cand];
      ftemp = (float) loc1;
      if(loc1 > 0) {		/* Was f0 actually estimated for this frame? */
	if (loc1 > buffer->start && loc1 < buffer->stop) { /* loc1 must be a local maximum. */
	  float cormax, cprev, cnext, den;
		  
	  j = loc1 - buffer->start;
	  cormax = frm->cp->correl[j];
	  cprev = frm->cp->correl[j+1];
	  cnext = frm->cp->correl[j-1];
	  den = (float) (2.0 * ( cprev + cnext - (2.0 * cormax) ));
	  /*
	   * Only parabolic interpolate if cormax is indeed a local 
	   * turning point. Find peak of curve that goes though the 3 points
	   */
		  
	  if (fabs(den) > 0.000001)
	    ftemp += 2.0f - ((((5.0f*cprev)+(3.0f*cnext)-(8.0f*cormax))/den));
	}
	buffer->f0p[i] = (float) (freq/ftemp);
      } else {		/* No valid estimate; just fake some arbitrary F0. */
	buffer->f0p[i] = 0;
	buffer->vuvp[i] = 0.0;
      }
      frm = frm->prev;
	  
      if (debug_level >= 2)
	Fprintf(stderr," i:%4d%8.1f%8.1f\n",i,buffer->f0p[i],buffer->vuvp[i]);
      /* f0p[i] starts from the most recent one */ 
      /* Need to reverse the order in the calling function */
      i++;
    } /* end while() */
    if (checkpath_done){
      *vecsize = i;
      buffer->tailF = buffer->cmpthF->next;
      buffer->num_active_frames -= *vecsize;
    }
  } /* end if() */

  if (debug_level)
    Fprintf(stderr, "writing out %d frames.\n", *vecsize);
  
  *f0p_pt = buffer->f0p;
  *vuvp_pt = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  /*  *acpkp_pt = acpkp;*/
  
  if(buffer->first_time) buffer->first_time = 0;
  return(0);
}